

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitCallTargetNoEvalComponents
               (ParseNode *pnodeTarget,BOOL fSideEffectArgs,RegSlot *thisLocation,
               bool *releaseThisLocation,RegSlot *callObjLocation,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  Symbol *sym;
  ParseNodeBin *pPVar2;
  ParseNodeName *pPVar3;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot *callObjLocation_local;
  bool *releaseThisLocation_local;
  RegSlot *thisLocation_local;
  BOOL fSideEffectArgs_local;
  ParseNode *pnodeTarget_local;
  
  *releaseThisLocation = true;
  OVar1 = pnodeTarget->nop;
  if (OVar1 == knopName) {
    pPVar3 = ParseNode::AsParseNodeName(pnodeTarget);
    sym = pPVar3->sym;
    pPVar3 = ParseNode::AsParseNodeName(pnodeTarget);
    ByteCodeGenerator::EmitLoadInstance
              (byteCodeGenerator,sym,pPVar3->pid,thisLocation,callObjLocation,funcInfo);
    if (*thisLocation == 0xffffffff) {
      *thisLocation = funcInfo->undefinedConstantRegister;
    }
  }
  else if (OVar1 == knopDot) {
    pPVar2 = ParseNode::AsParseNodeBin(pnodeTarget);
    *thisLocation = pPVar2->pnode1->location;
    pPVar2 = ParseNode::AsParseNodeBin(pnodeTarget);
    *callObjLocation = pPVar2->pnode1->location;
  }
  else if (OVar1 == knopIndex) {
    pPVar2 = ParseNode::AsParseNodeBin(pnodeTarget);
    *thisLocation = pPVar2->pnode1->location;
    pPVar2 = ParseNode::AsParseNodeBin(pnodeTarget);
    *callObjLocation = pPVar2->pnode1->location;
  }
  else {
    *thisLocation = funcInfo->undefinedConstantRegister;
  }
  return;
}

Assistant:

void EmitCallTargetNoEvalComponents(
    ParseNode *pnodeTarget,
    BOOL fSideEffectArgs,
    Js::RegSlot *thisLocation,
    bool *releaseThisLocation,
    Js::RegSlot *callObjLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    // We first get a reference to the call target, then evaluate the arguments, then
    // evaluate the call target.

    // - emit reference to target
    //    - copy instance to scratch reg if necessary.
    //    - assign this
    //    - assign instance for dynamic/global name
    // - emit args
    // - do call (CallFld/Elem/I)

    *releaseThisLocation = true;

    switch (pnodeTarget->nop)
    {
    case knopDot:
        *thisLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        *callObjLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        break;

    case knopIndex:
        *thisLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        *callObjLocation = pnodeTarget->AsParseNodeBin()->pnode1->location;
        break;

    case knopName:
        // If the call target is a name, do some extra work to get its instance and the "this" pointer.
        byteCodeGenerator->EmitLoadInstance(pnodeTarget->AsParseNodeName()->sym, pnodeTarget->AsParseNodeName()->pid, thisLocation, callObjLocation, funcInfo);
        if (*thisLocation == Js::Constants::NoRegister)
        {
            *thisLocation = funcInfo->undefinedConstantRegister;
        }

        break;

    default:
        *thisLocation = funcInfo->undefinedConstantRegister;
        break;
    }
}